

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O3

void __thiscall QBindingStoragePrivate::destroy(QBindingStoragePrivate *this)

{
  ulong uVar1;
  size_t allocSize;
  QBindingStorageData *ptr;
  size_t *this_00;
  ulong uVar2;
  
  ptr = *this->d;
  if (ptr != (QBindingStorageData *)0x0) {
    uVar1 = ptr->size;
    if (uVar1 == 0) {
      allocSize = 0x10;
    }
    else {
      this_00 = &ptr[1].used;
      uVar2 = 0;
      do {
        if (((QBindingStorageData *)(this_00 + -1))->size != 0) {
          QtPrivate::QPropertyBindingData::~QPropertyBindingData((QPropertyBindingData *)this_00);
          ptr = *this->d;
          uVar1 = ptr->size;
        }
        uVar2 = uVar2 + 1;
        this_00 = this_00 + 2;
      } while (uVar2 < uVar1);
      allocSize = uVar1 * 0x10 + 0x10;
    }
    QtPrivate::sizedFree(ptr,allocSize);
    return;
  }
  return;
}

Assistant:

void destroy()
    {
        if (!d)
            return;
        Pair *p = pairs(d);
        for (size_t i = 0; i < d->size; ++i) {
            if (p->data)
                p->~Pair();
            ++p;
        }
        const size_t allocSize = sizeof(QBindingStorageData) + d->size*sizeof(Pair);
        QtPrivate::sizedFree(d, allocSize);
    }